

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int gpioSetTimerFuncEx(uint id,uint millis,gpioTimerFuncEx_t f,void *userdata)

{
  FILE *pFVar1;
  int iVar2;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar1,"%s %s: id=%d millis=%d function=%08X, userdata=%08X\n",myTimeStamp::buf,
            "gpioSetTimerFuncEx",id,(ulong)millis,f,userdata);
  }
  pFVar1 = _stderr;
  if (libInitialised == '\0') {
    iVar2 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",myTimeStamp::buf,
              "gpioSetTimerFuncEx");
    }
  }
  else if (id < 10) {
    if (millis - 0xea61 < 0xffff15a9) {
      iVar2 = -10;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        myTimeStamp();
        fprintf(pFVar1,"%s %s: timer %d, bad millis (%d)\n",myTimeStamp::buf,"gpioSetTimerFuncEx",id
                ,(ulong)millis);
      }
    }
    else {
      intGpioSetTimerFunc(id,millis,f,1,userdata);
      iVar2 = 0;
    }
  }
  else {
    iVar2 = -9;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      myTimeStamp();
      fprintf(pFVar1,"%s %s: bad timer id (%d)\n",myTimeStamp::buf,"gpioSetTimerFuncEx",id);
    }
  }
  return iVar2;
}

Assistant:

int gpioSetTimerFuncEx(unsigned id, unsigned millis, gpioTimerFuncEx_t f,
                       void * userdata)
{
   DBG(DBG_USER, "id=%d millis=%d function=%08X, userdata=%08X",
      id, millis, (uint32_t)f, (uint32_t)userdata);

   CHECK_INITED;

   if (id > PI_MAX_TIMER)
      SOFT_ERROR(PI_BAD_TIMER, "bad timer id (%d)", id);

   if ((millis < PI_MIN_MS) || (millis > PI_MAX_MS))
      SOFT_ERROR(PI_BAD_MS, "timer %d, bad millis (%d)", id, millis);

   intGpioSetTimerFunc(id, millis, f, 1, userdata);

   return 0;
}